

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Cell.cpp
# Opt level: O0

void __thiscall
Nova::Grid_Iterator_Cell<float,_3>::Grid_Iterator_Cell
          (Grid_Iterator_Cell<float,_3> *this,Grid<float,_3> *grid_input,int number_of_ghost_cells,
          T_Region *region_type,int side)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  bool local_79;
  int local_74;
  int axis_3;
  int axis_2;
  T_INDEX max_copy;
  int axis_1;
  int axis;
  Range<int,_3> domain_copy;
  Range<int,_3> domain;
  int side_local;
  T_Region *region_type_local;
  int number_of_ghost_cells_local;
  Grid<float,_3> *grid_input_local;
  Grid_Iterator_Cell<float,_3> *this_local;
  
  domain.max_corner._data._M_elems[1] = side;
  unique0x10000c28 = region_type;
  Grid_Iterator<float,_3>::Grid_Iterator(&this->super_Grid_Iterator<float,_3>,grid_input);
  local_79 = 6 < (uint)domain.max_corner._data._M_elems[1];
  if (local_79) {
    __assert_fail("side>=0 && side<=2*d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xe,
                  "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                 );
  }
  bVar4 = false;
  if (*stack0xffffffffffffffd8 != Boundary_Region) {
    bVar4 = *stack0xffffffffffffffd8 != Interior_Region;
  }
  if (!bVar4) {
    __assert_fail("(region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                  ,0xf,
                  "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                 );
  }
  Grid<float,_3>::Cell_Indices
            ((Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1),
             (this->super_Grid_Iterator<float,_3>).grid,number_of_ghost_cells);
  if (*stack0xffffffffffffffd8 == Whole_Region) {
    if (domain.max_corner._data._M_elems[1] != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x14,
                    "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                   );
    }
    Grid_Iterator<float,_3>::Add_Region
              (&this->super_Grid_Iterator<float,_3>,
               (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
  }
  else if (*stack0xffffffffffffffd8 == Boundary_Interior_Region) {
    if (domain.max_corner._data._M_elems[1] == 0) {
      Range<int,_3>::Range
                ((Range<int,_3> *)&axis_1,
                 (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
      for (max_copy._data._M_elems[2] = 2; -1 < max_copy._data._M_elems[2];
          max_copy._data._M_elems[2] = max_copy._data._M_elems[2] + -1) {
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_3>::Add_Region
                  (&this->super_Grid_Iterator<float,_3>,
                   (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        *piVar3 = iVar2;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        *piVar3 = iVar2;
        Grid_Iterator<float,_3>::Add_Region
                  (&this->super_Grid_Iterator<float,_3>,
                   (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        *piVar3 = iVar2 + -1;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)&axis_1,max_copy._data._M_elems[2]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            max_copy._data._M_elems[2]);
        *piVar3 = iVar2 + 1;
      }
    }
    else {
      max_copy._data._M_elems[1] = (domain.max_corner._data._M_elems[1] + -1) / 2;
      if ((domain.max_corner._data._M_elems[1] & 1U) == 0) {
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            max_copy._data._M_elems[1]);
        *piVar3 = iVar2;
      }
      else {
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            max_copy._data._M_elems[1]);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),
                            max_copy._data._M_elems[1]);
        *piVar3 = iVar2;
      }
      Grid_Iterator<float,_3>::Add_Region
                (&this->super_Grid_Iterator<float,_3>,
                 (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
    }
  }
  else {
    if (*stack0xffffffffffffffd8 != Ghost_Region || number_of_ghost_cells < 1) {
      __assert_fail("(region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Cell.cpp"
                    ,0x2e,
                    "Nova::Grid_Iterator_Cell<float, 3>::Grid_Iterator_Cell(const Grid<T, d> &, const int, const T_Region &, const int) [T = float, d = 3]"
                   );
    }
    if (domain.max_corner._data._M_elems[1] == 0) {
      Vector<int,_3,_true>::Vector
                ((Vector<int,_3,_true> *)&axis_3,
                 (Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1));
      for (local_74 = 2; -1 < local_74; local_74 = local_74 + -1) {
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),local_74)
        ;
        *piVar3 = 0;
        Grid_Iterator<float,_3>::Add_Region
                  (&this->super_Grid_Iterator<float,_3>,
                   (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
        piVar3 = Vector<int,_3,_true>::operator()((Vector<int,_3,_true> *)&axis_3,local_74);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),local_74)
        ;
        *piVar3 = iVar2;
        piVar3 = Vector<int,_3,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_3>).grid)->counts,local_74);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            local_74);
        *piVar3 = iVar2 + 1;
        Grid_Iterator<float,_3>::Add_Region
                  (&this->super_Grid_Iterator<float,_3>,
                   (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
        piVar3 = Vector<int,_3,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_3>).grid)->counts,local_74);
        iVar2 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),local_74)
        ;
        *piVar3 = iVar2;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            local_74);
        *piVar3 = 1;
      }
    }
    else {
      iVar2 = (domain.max_corner._data._M_elems[1] + -1) / 2;
      if ((domain.max_corner._data._M_elems[1] & 1U) == 0) {
        piVar3 = Vector<int,_3,_true>::operator()
                           (&((this->super_Grid_Iterator<float,_3>).grid)->counts,iVar2);
        iVar1 = *piVar3;
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain_copy.max_corner._data._M_elems + 1),
                            iVar2);
        *piVar3 = iVar1 + 1;
      }
      else {
        piVar3 = Vector<int,_3,_true>::operator()
                           ((Vector<int,_3,_true> *)(domain.min_corner._data._M_elems + 1),iVar2);
        *piVar3 = 0;
      }
      Grid_Iterator<float,_3>::Add_Region
                (&this->super_Grid_Iterator<float,_3>,
                 (Range<int,_3> *)(domain_copy.max_corner._data._M_elems + 1));
    }
  }
  Grid_Iterator<float,_3>::Reset(&this->super_Grid_Iterator<float,_3>,0);
  return;
}

Assistant:

Grid_Iterator_Cell<T,d>::
Grid_Iterator_Cell(const Grid<T,d>& grid_input,const int number_of_ghost_cells,const T_Region& region_type,const int side)
    :Base(grid_input)
{
    assert(side>=0 && side<=2*d);
    assert((region_type!=Grid<T,d>::Boundary_Region && region_type!=Grid<T,d>::Interior_Region));
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:               assert(!side);
                                                    Add_Region(domain);
                                                    break;

        case Grid<T,d>::Boundary_Interior_Region:   if(!side)
                                                    {
                                                        Range<int,d> domain_copy(domain);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=domain.min_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain.min_corner(axis)=domain_copy.max_corner(axis);
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=domain_copy.max_corner(axis)-1;
                                                            domain.min_corner(axis)=domain_copy.min_corner(axis)+1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=domain.min_corner(axis);
                                                        else domain.min_corner(axis)=domain.max_corner(axis);
                                                        Add_Region(domain);
                                                    }
                                                    break;

        default:                                    assert((region_type==Grid<T,d>::Ghost_Region && number_of_ghost_cells>0));
                                                    if(!side)
                                                    {
                                                        T_INDEX max_copy(domain.max_corner);
                                                        for(int axis=d-1;axis>=0;--axis)
                                                        {
                                                            domain.max_corner(axis)=0;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=max_copy(axis);
                                                            domain.min_corner(axis)=grid.counts(axis)+1;
                                                            Add_Region(domain);
                                                            domain.max_corner(axis)=grid.counts(axis);
                                                            domain.min_corner(axis)=1;
                                                        }
                                                    }
                                                    else
                                                    {
                                                        int axis=(side-1)/2;
                                                        if(side&1) domain.max_corner(axis)=0;
                                                        else domain.min_corner(axis)=grid.counts(axis)+1;
                                                        Add_Region(domain);
                                                    }
                                                    break;
    }
    Reset();
}